

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_apply_encoding_flags(AV1_COMP *cpi,aom_enc_frame_flags_t flags)

{
  int ref_frame_flags;
  ExternalFlags *ext_ref_frame_flags;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags_00;
  ulong in_RSI;
  AV1_COMP *in_RDI;
  bool bVar1;
  int upd;
  int ref_1;
  int ref;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags;
  ExternalFlags *ext_flags;
  uint local_24;
  
  ext_ref_frame_flags = &in_RDI->ext_flags;
  ext_refresh_frame_flags_00 = &(in_RDI->ext_flags).refresh_frame;
  ext_ref_frame_flags->ref_frame_flags = 0x7f;
  if ((in_RSI & 0x7f0000) == 0) {
    if ((in_RDI->ppi->rtc_ref).set_ref_frame_config != 0) {
      ref_frame_flags = rtc_set_references_external_ref_frame_config(in_RDI);
      av1_use_as_reference(&ext_ref_frame_flags->ref_frame_flags,ref_frame_flags);
    }
  }
  else {
    local_24 = 0x7f;
    if ((in_RSI & 0x10000) != 0) {
      local_24 = 0x7e;
    }
    if ((in_RSI & 0x20000) != 0) {
      local_24 = local_24 ^ 2;
    }
    if ((in_RSI & 0x40000) != 0) {
      local_24 = local_24 ^ 4;
    }
    if ((in_RSI & 0x80000) != 0) {
      local_24 = local_24 ^ 8;
    }
    if ((in_RSI & 0x100000) == 0) {
      if ((in_RSI & 0x200000) != 0) {
        local_24 = local_24 ^ 0x10;
      }
      if ((in_RSI & 0x400000) != 0) {
        local_24 = local_24 ^ 0x20;
      }
    }
    else {
      local_24 = local_24 ^ 0x70;
    }
    av1_use_as_reference(&ext_ref_frame_flags->ref_frame_flags,local_24);
  }
  if ((in_RSI & 0x3800000) == 0) {
    if ((in_RDI->ppi->rtc_ref).set_ref_frame_config == 0) {
      (in_RDI->ext_flags).refresh_frame.update_pending = false;
    }
    else {
      rtc_set_updates_ref_frame_config(ext_refresh_frame_flags_00,&in_RDI->ppi->rtc_ref);
    }
  }
  else {
    bVar1 = (in_RSI & 0x2000000) == 0;
    ext_refresh_frame_flags_00->last_frame = (in_RSI & 0x800000) == 0;
    (in_RDI->ext_flags).refresh_frame.golden_frame = (in_RSI & 0x1000000) == 0;
    (in_RDI->ext_flags).refresh_frame.alt_ref_frame = bVar1;
    (in_RDI->ext_flags).refresh_frame.bwd_ref_frame = bVar1;
    (in_RDI->ext_flags).refresh_frame.alt2_ref_frame = bVar1;
    (in_RDI->ext_flags).refresh_frame.update_pending = true;
  }
  (in_RDI->ext_flags).use_ref_frame_mvs =
       ((in_RDI->oxcf).tool_cfg.enable_ref_frame_mvs & 1U & (in_RSI & 0x8000000) == 0) != 0;
  (in_RDI->ext_flags).use_error_resilient =
       ((in_RDI->oxcf).tool_cfg.error_resilient_mode & 1U) != 0 || (in_RSI & 0x10000000) != 0;
  (in_RDI->ext_flags).use_s_frame =
       ((in_RDI->oxcf).kf_cfg.enable_sframe & 1U) != 0 || (in_RSI & 0x20000000) != 0;
  (in_RDI->ext_flags).use_primary_ref_none = (in_RSI & 0x40000000) != 0;
  if ((in_RSI & 0x4000000) != 0) {
    update_entropy(&(in_RDI->ext_flags).refresh_frame_context,
                   &(in_RDI->ext_flags).refresh_frame_context_pending,false);
  }
  return;
}

Assistant:

void av1_apply_encoding_flags(AV1_COMP *cpi, aom_enc_frame_flags_t flags) {
  // TODO(yunqingwang): For what references to use, external encoding flags
  // should be consistent with internal reference frame selection. Need to
  // ensure that there is not conflict between the two. In AV1 encoder, the
  // priority rank for 7 reference frames are: LAST, ALTREF, LAST2, LAST3,
  // GOLDEN, BWDREF, ALTREF2.

  ExternalFlags *const ext_flags = &cpi->ext_flags;
  ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &ext_flags->refresh_frame;
  ext_flags->ref_frame_flags = AOM_REFFRAME_ALL;
  if (flags &
      (AOM_EFLAG_NO_REF_LAST | AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
       AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF | AOM_EFLAG_NO_REF_BWD |
       AOM_EFLAG_NO_REF_ARF2)) {
    int ref = AOM_REFFRAME_ALL;

    if (flags & AOM_EFLAG_NO_REF_LAST) ref ^= AOM_LAST_FLAG;
    if (flags & AOM_EFLAG_NO_REF_LAST2) ref ^= AOM_LAST2_FLAG;
    if (flags & AOM_EFLAG_NO_REF_LAST3) ref ^= AOM_LAST3_FLAG;

    if (flags & AOM_EFLAG_NO_REF_GF) ref ^= AOM_GOLD_FLAG;

    if (flags & AOM_EFLAG_NO_REF_ARF) {
      ref ^= AOM_ALT_FLAG;
      ref ^= AOM_BWD_FLAG;
      ref ^= AOM_ALT2_FLAG;
    } else {
      if (flags & AOM_EFLAG_NO_REF_BWD) ref ^= AOM_BWD_FLAG;
      if (flags & AOM_EFLAG_NO_REF_ARF2) ref ^= AOM_ALT2_FLAG;
    }

    av1_use_as_reference(&ext_flags->ref_frame_flags, ref);
  } else {
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int ref = rtc_set_references_external_ref_frame_config(cpi);
      av1_use_as_reference(&ext_flags->ref_frame_flags, ref);
    }
  }

  if (flags &
      (AOM_EFLAG_NO_UPD_LAST | AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF)) {
    int upd = AOM_REFFRAME_ALL;

    // Refreshing LAST/LAST2/LAST3 is handled by 1 common flag.
    if (flags & AOM_EFLAG_NO_UPD_LAST) upd ^= AOM_LAST_FLAG;

    if (flags & AOM_EFLAG_NO_UPD_GF) upd ^= AOM_GOLD_FLAG;

    if (flags & AOM_EFLAG_NO_UPD_ARF) {
      upd ^= AOM_ALT_FLAG;
      upd ^= AOM_BWD_FLAG;
      upd ^= AOM_ALT2_FLAG;
    }

    ext_refresh_frame_flags->last_frame = (upd & AOM_LAST_FLAG) != 0;
    ext_refresh_frame_flags->golden_frame = (upd & AOM_GOLD_FLAG) != 0;
    ext_refresh_frame_flags->alt_ref_frame = (upd & AOM_ALT_FLAG) != 0;
    ext_refresh_frame_flags->bwd_ref_frame = (upd & AOM_BWD_FLAG) != 0;
    ext_refresh_frame_flags->alt2_ref_frame = (upd & AOM_ALT2_FLAG) != 0;
    ext_refresh_frame_flags->update_pending = 1;
  } else {
    if (cpi->ppi->rtc_ref.set_ref_frame_config)
      rtc_set_updates_ref_frame_config(ext_refresh_frame_flags,
                                       &cpi->ppi->rtc_ref);
    else
      ext_refresh_frame_flags->update_pending = 0;
  }

  ext_flags->use_ref_frame_mvs = cpi->oxcf.tool_cfg.enable_ref_frame_mvs &
                                 ((flags & AOM_EFLAG_NO_REF_FRAME_MVS) == 0);
  ext_flags->use_error_resilient = cpi->oxcf.tool_cfg.error_resilient_mode |
                                   ((flags & AOM_EFLAG_ERROR_RESILIENT) != 0);
  ext_flags->use_s_frame =
      cpi->oxcf.kf_cfg.enable_sframe | ((flags & AOM_EFLAG_SET_S_FRAME) != 0);
  ext_flags->use_primary_ref_none =
      (flags & AOM_EFLAG_SET_PRIMARY_REF_NONE) != 0;

  if (flags & AOM_EFLAG_NO_UPD_ENTROPY) {
    update_entropy(&ext_flags->refresh_frame_context,
                   &ext_flags->refresh_frame_context_pending, 0);
  }
}